

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O1

void __thiscall
bidirectional::BiDirectional::updateBestLabels
          (BiDirectional *this,Directions *direction,Label *candidate_label)

{
  Vertex *lemon_id;
  _Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_> this_00;
  double *pdVar1;
  bool bVar2;
  bool local_2a;
  bool local_29;
  
  lemon_id = &candidate_label->vertex;
  this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl =
       (&this->fwd_search_ptr_)[*direction != FWD]._M_t.
       super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>.
       _M_t.
       super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>.
       super__Head_base<0UL,_bidirectional::Search_*,_false>;
  if ((*direction == FWD) &&
     (lemon_id->lemon_id ==
      (((this->graph_ptr_)._M_t.
        super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>.
        _M_t.
        super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
        .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->sink).lemon_id)) {
    local_29 = false;
    bVar2 = labelling::Label::checkFeasibility
                      (candidate_label,&this->max_res,&this->min_res,&local_29);
    if (!bVar2) {
      return;
    }
  }
  if ((*direction == BWD) &&
     (lemon_id->lemon_id ==
      (((this->graph_ptr_)._M_t.
        super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>.
        _M_t.
        super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
        .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->source).lemon_id)) {
    local_2a = false;
    bVar2 = labelling::Label::checkFeasibility
                      (candidate_label,&this->max_res,&this->min_res,&local_2a);
    if (!bVar2) {
      return;
    }
  }
  pdVar1 = *(double **)
            &(((vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                *)((long)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl
                  + 0x88))->
             super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
             )._M_impl.super__Vector_impl_data._M_start[lemon_id->lemon_id].
             super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>;
  if (((pdVar1 == (double *)0x0) || (pdVar1 == (double *)0x0)) ||
     (candidate_label->weight <= *pdVar1 && *pdVar1 != candidate_label->weight)) {
    Search::replaceBestLabel
              ((Search *)this_00.super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl,
               &lemon_id->lemon_id,candidate_label);
  }
  return;
}

Assistant:

void BiDirectional::updateBestLabels(
    const Directions&       direction,
    const labelling::Label& candidate_label) {
  // Only save full paths when they are global resource feasible
  Search*    search_ptr = getSearchPtr(direction);
  const int& lemon_id   = candidate_label.vertex.lemon_id;
  std::vector<std::shared_ptr<labelling::Label>>& best_labels =
      search_ptr->best_labels;

  bool stop = false;
  if (direction == FWD && lemon_id == graph_ptr_->sink.lemon_id &&
      !candidate_label.checkFeasibility(max_res, min_res)) {
    stop = true;
  } else if (
      direction == BWD && lemon_id == graph_ptr_->source.lemon_id &&
      !candidate_label.checkFeasibility(max_res, min_res)) {
    stop = true;
  }
  if (stop) {
    SPDLOG_DEBUG("\t Label not globally feasible and not s-t path.");
    return;
  }
  // Update best_label only when new label has lower weight or first label
  if ((best_labels[lemon_id] &&
       candidate_label.weight < best_labels[lemon_id]->weight) ||
      !best_labels[lemon_id]) {
    search_ptr->replaceBestLabel(lemon_id, candidate_label);
    SPDLOG_DEBUG(
        "\t Vertex improvement with {}.",
        search_ptr->best_labels[lemon_id]->getString());
  }
}